

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O2

int Test_N_VDotProdLocal(N_Vector X,N_Vector Y,sunindextype param_3,int myid)

{
  int iVar1;
  double val;
  double dVar2;
  undefined8 uVar3;
  double dVar4;
  
  val = (double)myid;
  set_element_range(X,0,param_3 + -1,val);
  set_element_range(Y,0,param_3 + -1,1.0 / (double)param_3);
  dVar2 = get_time();
  uVar3 = N_VDotProdLocal(X,Y);
  sync_device(X);
  dVar4 = get_time();
  iVar1 = SUNRCompareTol(uVar3,val,0x3e50000000000000);
  if (iVar1 == 0) {
    iVar1 = 0;
    if (myid == 0) {
      puts("PASSED test -- N_VDotProdLocal");
      iVar1 = 0;
    }
  }
  else {
    printf(">>> FAILED test -- N_VDotProdLocal, Proc %d\n",(ulong)(uint)myid);
    printf("ans = %.17f expected = %.17f\n",uVar3,val);
    iVar1 = 1;
  }
  max_time(X,dVar4 - dVar2);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VDotProdLocal");
  }
  return iVar1;
}

Assistant:

int Test_N_VDotProdLocal(N_Vector X, N_Vector Y, sunindextype local_length,
                         int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunrealtype ans, rmyid, locleninv;

  /* fill vector data */
  rmyid     = (sunrealtype)myid;
  locleninv = ONE / local_length;
  set_element_range(X, 0, local_length - 1, rmyid);
  set_element_range(Y, 0, local_length - 1, locleninv);

  start_time = get_time();
  ans        = N_VDotProdLocal(X, Y);
  sync_device(X);
  stop_time = get_time();

  /* ans should equal rmyid */
  failure = SUNRCompareTol(ans, rmyid, SUNRsqrt(SUN_UNIT_ROUNDOFF));

  if (failure)
  {
    printf(">>> FAILED test -- N_VDotProdLocal, Proc %d\n", myid);
    printf("ans = %" FSYM " expected = %" FSYM "\n", ans, rmyid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VDotProdLocal\n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VDotProdLocal", maxt);

  return (fails);
}